

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AppendPositionIndependentLinkerFlags
          (cmLocalGenerator *this,string *flags,cmGeneratorTarget *target,string *config,
          string *lang)

{
  bool bVar1;
  TargetType TVar2;
  char *pcVar3;
  string *psVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *flag;
  _Alloc_hider _Var5;
  string_view arg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  flagsList;
  string pieFlags;
  string name;
  string supported;
  string mode;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  TVar2 = cmGeneratorTarget::GetType(target);
  if (TVar2 == EXECUTABLE) {
    pcVar3 = cmGeneratorTarget::GetLinkPIEProperty(target,config);
    if (pcVar3 != (char *)0x0) {
      bVar1 = cmValue::IsOn(pcVar3);
      pcVar3 = "NO_PIE";
      if (bVar1) {
        pcVar3 = "PIE";
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,pcVar3,(allocator<char> *)&local_68);
      std::operator+(&local_c8,"CMAKE_",lang);
      std::operator+(&local_a8,&local_c8,"_LINK_");
      std::operator+(&local_88,&local_a8,&local_48);
      std::operator+(&local_68,&local_88,"_SUPPORTED");
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      cmMakefile::GetDefinition(this->Makefile,&local_68);
      bVar1 = cmIsOff((cmValue)0x232d3e);
      if (!bVar1) {
        std::operator+(&local_c8,"CMAKE_",lang);
        std::operator+(&local_a8,&local_c8,"_LINK_OPTIONS_");
        std::operator+(&local_88,&local_a8,&local_48);
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_c8);
        psVar4 = cmMakefile::GetSafeDefinition(this->Makefile,&local_88);
        std::__cxx11::string::string((string *)&local_a8,(string *)psVar4);
        if (local_a8._M_string_length != 0) {
          arg._M_str = local_a8._M_dataplus._M_p;
          arg._M_len = local_a8._M_string_length;
          cmExpandedList_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_c8,arg,false);
          for (_Var5._M_p = local_c8._M_dataplus._M_p;
              _Var5._M_p != (pointer)local_c8._M_string_length; _Var5._M_p = _Var5._M_p + 0x20) {
            (*this->_vptr_cmLocalGenerator[8])(this,flags,_Var5._M_p);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_c8);
        }
        std::__cxx11::string::~string((string *)&local_a8);
        std::__cxx11::string::~string((string *)&local_88);
      }
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_48);
    }
  }
  return;
}

Assistant:

void cmLocalGenerator::AppendPositionIndependentLinkerFlags(
  std::string& flags, cmGeneratorTarget* target, const std::string& config,
  const std::string& lang)
{
  // For now, only EXECUTABLE is concerned
  if (target->GetType() != cmStateEnums::EXECUTABLE) {
    return;
  }

  const char* PICValue = target->GetLinkPIEProperty(config);
  if (PICValue == nullptr) {
    // POSITION_INDEPENDENT_CODE is not set
    return;
  }

  const std::string mode = cmIsOn(PICValue) ? "PIE" : "NO_PIE";

  std::string supported = "CMAKE_" + lang + "_LINK_" + mode + "_SUPPORTED";
  if (cmIsOff(this->Makefile->GetDefinition(supported))) {
    return;
  }

  std::string name = "CMAKE_" + lang + "_LINK_OPTIONS_" + mode;

  auto pieFlags = this->Makefile->GetSafeDefinition(name);
  if (pieFlags.empty()) {
    return;
  }

  std::vector<std::string> flagsList = cmExpandedList(pieFlags);
  for (const auto& flag : flagsList) {
    this->AppendFlagEscape(flags, flag);
  }
}